

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manager.cpp
# Opt level: O0

void __thiscall SHOPManagement::Manager::display(Manager *this)

{
  ostream *poVar1;
  size_type sVar2;
  reference ppAVar3;
  int local_a4;
  int len;
  int i;
  string local_80;
  string local_60;
  string local_30 [32];
  Manager *local_10;
  Manager *this_local;
  
  local_10 = this;
  poVar1 = std::operator<<((ostream *)&std::cout,"*** ");
  (*(this->super_Person).super_User._vptr_User[2])();
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1," Information ***");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,"First Name: ");
  Person::getFirstName_abi_cxx11_(&local_60,&this->super_Person);
  poVar1 = std::operator<<(poVar1,(string *)&local_60);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_60);
  poVar1 = std::operator<<((ostream *)&std::cout,"Last Name: ");
  Person::getLastName_abi_cxx11_(&local_80,&this->super_Person);
  poVar1 = std::operator<<(poVar1,(string *)&local_80);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_80);
  poVar1 = std::operator<<((ostream *)&std::cout,"Phone Number: ");
  Person::getPhoneNumber_abi_cxx11_((string *)&len,&this->super_Person);
  poVar1 = std::operator<<(poVar1,(string *)&len);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&len);
  local_a4 = 0;
  sVar2 = std::vector<SHOPManagement::Address_*,_std::allocator<SHOPManagement::Address_*>_>::size
                    (&(this->super_Person).v_adress_list);
  for (; local_a4 < (int)sVar2; local_a4 = local_a4 + 1) {
    ppAVar3 = std::vector<SHOPManagement::Address_*,_std::allocator<SHOPManagement::Address_*>_>::at
                        (&(this->super_Person).v_adress_list,(long)local_a4);
    (**(*ppAVar3)->_vptr_Address)();
  }
  return;
}

Assistant:

void Manager::display()
    {
        std::cout << "*** " << this->className() << " Information ***" << std::endl;
        std::cout << "First Name: " << this->getFirstName() << std::endl;
        std::cout << "Last Name: " << this->getLastName() << std::endl;
        std::cout << "Phone Number: " << this->getPhoneNumber() << std::endl;

        for (int i = 0, len = this->v_adress_list.size(); i < len; i++)
        {
            this->v_adress_list.at(i)->display();
        }
    }